

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

void __thiscall QAccessibleWidget::doAction(QAccessibleWidget *this,QString *actionName)

{
  bool bVar1;
  QWidget *pQVar2;
  QString *s2;
  
  pQVar2 = widget(this);
  if ((pQVar2->data->widget_attributes & 1) == 0) {
    s2 = (QString *)QAccessibleActionInterface::setFocusAction();
    bVar1 = ::comparesEqual(actionName,s2);
    if (bVar1) {
      pQVar2 = widget(this);
      if (((pQVar2->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
        pQVar2 = widget(this);
        QWidget::activateWindow(pQVar2);
      }
      pQVar2 = widget(this);
      QWidget::setFocus(pQVar2);
      return;
    }
  }
  return;
}

Assistant:

void QAccessibleWidget::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;

    if (actionName == setFocusAction()) {
        if (widget()->isWindow())
            widget()->activateWindow();
        widget()->setFocus();
    }
}